

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O3

RTCScene embree::convertScene(ISPCScene *scene_in)

{
  RTCScene pRVar1;
  ulong uVar2;
  RTCFeatureFlags feature_mask;
  RTCFeatureFlags local_c;
  
  if ((ulong)scene_in->numGeometries != 0) {
    uVar2 = 0;
    do {
      if (scene_in->geometries[uVar2]->type == SUBDIV_MESH) {
        data[0x20] = 1;
        break;
      }
      uVar2 = uVar2 + 1;
    } while (scene_in->numGeometries != uVar2);
  }
  local_c = RTC_FEATURE_FLAG_NONE;
  pRVar1 = ConvertScene(g_device,g_ispc_scene,RTC_BUILD_QUALITY_MEDIUM,RTC_SCENE_FLAG_NONE,&local_c)
  ;
  if (g_use_scene_features == true) {
    g_feature_mask = local_c;
  }
  rtcSetSceneProgressMonitorFunction(pRVar1,monitorProgressFunction,0);
  return pRVar1;
}

Assistant:

RTCScene convertScene(ISPCScene* scene_in)
{
  for (unsigned int i=0; i<scene_in->numGeometries; i++)
  {
    ISPCGeometry* geometry = scene_in->geometries[i];
    if (geometry->type == SUBDIV_MESH) {
      data.subdiv_mode = true; break;
    }
  }

  RTCFeatureFlags feature_mask = RTC_FEATURE_FLAG_NONE;
  RTCScene scene_out = ConvertScene(g_device, g_ispc_scene, RTC_BUILD_QUALITY_MEDIUM, RTC_SCENE_FLAG_NONE, &feature_mask);
  if (g_use_scene_features) g_feature_mask = feature_mask;
  rtcSetSceneProgressMonitorFunction(scene_out,monitorProgressFunction,nullptr);

  /* commit changes to scene */
  return scene_out;
}